

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall
HTTPEvent::HTTPEvent
          (HTTPEvent *this,event_base *base,bool _deleteWhenTriggered,function<void_()> *_handler)

{
  long lVar1;
  event *peVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->deleteWhenTriggered = _deleteWhenTriggered;
  std::function<void_()>::function(&this->handler,_handler);
  peVar2 = (event *)event_new(base,0xffffffff,0,httpevent_callback_fn,this);
  this->ev = peVar2;
  if (peVar2 == (event *)0x0) {
    __assert_fail("ev",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                  ,0x23d,
                  "HTTPEvent::HTTPEvent(struct event_base *, bool, const std::function<void ()> &)")
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPEvent::HTTPEvent(struct event_base* base, bool _deleteWhenTriggered, const std::function<void()>& _handler):
    deleteWhenTriggered(_deleteWhenTriggered), handler(_handler)
{
    ev = event_new(base, -1, 0, httpevent_callback_fn, this);
    assert(ev);
}